

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O3

MPP_RET vdpu_av1d_init(void *hal,MppHalCfg *cfg)

{
  int iVar1;
  long lVar2;
  MPP_RET MVar3;
  undefined8 in_RAX;
  void *pvVar4;
  void *__s;
  undefined8 *puVar5;
  ulong uVar6;
  bool bVar7;
  undefined4 uVar9;
  undefined8 uVar8;
  
  if (hal == (void *)0x0) {
    if ((hal_av1d_debug & 4) == 0) {
      return MPP_OK;
    }
    _mpp_log_l(4,"hal_av1d_vdpu","input empty(%d).\n",(char *)0x0,0x109);
    return MPP_OK;
  }
  iVar1 = *(int *)((long)hal + 0x58);
  pvVar4 = mpp_osal_calloc("hal_av1d_alloc_res",0x1e7d0);
  uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
  *(void **)((long)hal + 0x50) = pvVar4;
  if (pvVar4 == (void *)0x0) {
    if ((hal_av1d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu","malloc buffer error(%d).\n",(char *)0x0,0x8b);
    }
    if ((hal_av1d_debug & 2) == 0) goto LAB_0021611e;
    uVar8 = CONCAT44(uVar9,0x8b);
  }
  else {
    puVar5 = (undefined8 *)((long)pvVar4 + 8);
    uVar6 = 0;
    do {
      __s = mpp_osal_calloc("hal_av1d_alloc_res",0x800);
      *puVar5 = __s;
      memset(__s,0,0x800);
      uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
      if (iVar1 == 0) break;
      puVar5 = puVar5 + 2;
      bVar7 = uVar6 < 2;
      uVar6 = uVar6 + 1;
    } while (bVar7);
    if (*(int *)((long)hal + 0x58) == 0) {
      *(undefined8 *)((long)pvVar4 + 0x1e7a8) = *(undefined8 *)((long)pvVar4 + 8);
    }
    MVar3 = mpp_buffer_get_with_tag
                      (*(MppBufferGroup *)((long)hal + 0x38),(MppBuffer *)((long)pvVar4 + 0x30),
                       0x3000,"hal_av1d_vdpu","hal_av1d_alloc_res");
    if (MVar3 == MPP_OK) {
      MVar3 = mpp_buffer_get_with_tag
                        (*(MppBufferGroup *)((long)hal + 0x38),(MppBuffer *)((long)pvVar4 + 0x38),
                         0x3000,"hal_av1d_vdpu","hal_av1d_alloc_res");
      if (MVar3 == MPP_OK) {
        MVar3 = mpp_buffer_get_with_tag
                          (*(MppBufferGroup *)((long)hal + 0x38),(MppBuffer *)((long)pvVar4 + 0x40),
                           0x800,"hal_av1d_vdpu","hal_av1d_alloc_res");
        if (MVar3 == MPP_OK) {
          MVar3 = mpp_buffer_get_with_tag
                            (*(MppBufferGroup *)((long)hal + 0x38),
                             (MppBuffer *)((long)pvVar4 + 0x48),0x3800,"hal_av1d_vdpu",
                             "hal_av1d_alloc_res");
          if (MVar3 == MPP_OK) {
            MVar3 = mpp_buffer_get_with_tag
                              (*(MppBufferGroup *)((long)hal + 0x38),
                               (MppBuffer *)((long)pvVar4 + 0x50),0x800,"hal_av1d_vdpu",
                               "hal_av1d_alloc_res");
            if (MVar3 == MPP_OK) {
              MVar3 = mpp_buffer_get_with_tag
                                (*(MppBufferGroup *)((long)hal + 0x38),
                                 (MppBuffer *)((long)pvVar4 + 0x60),0x1000,"hal_av1d_vdpu",
                                 "hal_av1d_alloc_res");
              if (MVar3 == MPP_OK) {
                lVar2 = *(long *)((long)hal + 0x50);
                *(long *)(lVar2 + 0x98) = lVar2 + 0xa8;
                *(long *)(lVar2 + 0xa0) = lVar2 + 0x3088;
                *(undefined1 *)(lVar2 + 0x1e783) = 1;
                mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_HOR_ALIGN,rkv_hor_align)
                ;
                mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_VER_ALIGN,rkv_ver_align)
                ;
                mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_LEN_ALIGN,rkv_len_align)
                ;
                return MPP_OK;
              }
              if ((hal_av1d_debug & 1) != 0) {
                _mpp_log_l(4,"hal_av1d_vdpu","buffer get error(%d).\n",(char *)0x0,0x9d);
              }
              if ((hal_av1d_debug & 2) == 0) goto LAB_0021611e;
              uVar8 = CONCAT44(uVar9,0x9d);
            }
            else {
              if ((hal_av1d_debug & 1) != 0) {
                _mpp_log_l(4,"hal_av1d_vdpu","buffer get error(%d).\n",(char *)0x0,0x9c);
              }
              if ((hal_av1d_debug & 2) == 0) goto LAB_0021611e;
              uVar8 = CONCAT44(uVar9,0x9c);
            }
          }
          else {
            if ((hal_av1d_debug & 1) != 0) {
              _mpp_log_l(4,"hal_av1d_vdpu","buffer get error(%d).\n",(char *)0x0,0x9b);
            }
            if ((hal_av1d_debug & 2) == 0) goto LAB_0021611e;
            uVar8 = CONCAT44(uVar9,0x9b);
          }
        }
        else {
          if ((hal_av1d_debug & 1) != 0) {
            _mpp_log_l(4,"hal_av1d_vdpu","buffer get error(%d).\n",(char *)0x0,0x9a);
          }
          if ((hal_av1d_debug & 2) == 0) goto LAB_0021611e;
          uVar8 = CONCAT44(uVar9,0x9a);
        }
      }
      else {
        if ((hal_av1d_debug & 1) != 0) {
          _mpp_log_l(4,"hal_av1d_vdpu","buffer get error(%d).\n",(char *)0x0,0x99);
        }
        if ((hal_av1d_debug & 2) == 0) goto LAB_0021611e;
        uVar8 = CONCAT44(uVar9,0x99);
      }
    }
    else {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer get error(%d).\n",(char *)0x0,0x98);
      }
      if ((hal_av1d_debug & 2) == 0) goto LAB_0021611e;
      uVar8 = CONCAT44(uVar9,0x98);
    }
  }
  _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0","hal_av1d_alloc_res"
             ,uVar8);
  if ((mpp_debug._3_1_ & 0x10) != 0) {
    abort();
  }
LAB_0021611e:
  if ((hal_av1d_debug & 4) != 0) {
    _mpp_log_l(4,"hal_av1d_vdpu","Function error(%d).\n",(char *)0x0,0x10b);
  }
  vdpu_av1d_deinit(hal);
  return MPP_OK;
}

Assistant:

MPP_RET vdpu_av1d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    INP_CHECK(ret, NULL == p_hal);

    FUN_CHECK(hal_av1d_alloc_res(hal));

    {
        VdpuAv1dRegCtx *reg_ctx = (VdpuAv1dRegCtx *)p_hal->reg_ctx;

        reg_ctx->cdfs = &reg_ctx->default_cdfs;
        reg_ctx->cdfs_ndvc = &reg_ctx->default_cdfs_ndvc;
        reg_ctx->tile_transpose = 1;
    }

    mpp_slots_set_prop(p_hal->slots, SLOTS_HOR_ALIGN, rkv_hor_align);
    mpp_slots_set_prop(p_hal->slots, SLOTS_VER_ALIGN, rkv_ver_align);
    mpp_slots_set_prop(p_hal->slots, SLOTS_LEN_ALIGN, rkv_len_align);

    (void)cfg;
__RETURN:
    return MPP_OK;
__FAILED:
    vdpu_av1d_deinit(hal);

    return ret;
}